

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::detail::BuildSkelHierarchyImpl
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *visitSet,SkelNode *parentNode,vector<int,_std::allocator<int>_> *parentJointIds,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  string *psVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  string *err_00;
  pointer pmVar5;
  double *pdVar6;
  byte bVar7;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  int local_168;
  double local_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  pointer local_60;
  pointer pSStack_58;
  pointer local_50;
  _Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_48;
  
  bVar7 = 0;
  err_00 = (string *)0x0;
  while( true ) {
    psVar1 = (string *)
             ((long)(parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2);
    if (psVar1 <= err_00) break;
    sVar2 = ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            count(visitSet,(key_type *)&stack0xfffffffffffffe20);
    if ((sVar2 == 0) &&
       (parentNode->joint_id ==
        (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[(long)err_00])) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_188._M_p = (pointer)&local_178;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_160 = 1.0;
      local_148 = 0.0;
      dStack_140 = 0.0;
      local_158 = 0.0;
      dStack_150 = 0.0;
      local_138 = 1.0;
      local_120 = 0.0;
      dStack_118 = 0.0;
      local_130 = 0.0;
      dStack_128 = 0.0;
      local_110 = 1.0;
      local_f8 = 0.0;
      dStack_f0 = 0.0;
      local_108 = 0.0;
      dStack_100 = 0.0;
      local_e8 = 1.0;
      dStack_e0 = 1.0;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      local_d8 = 0.0;
      dStack_d0 = 0.0;
      local_b8 = 1.0;
      local_a0 = 0.0;
      dStack_98 = 0.0;
      local_b0 = 0.0;
      dStack_a8 = 0.0;
      local_90 = 1.0;
      local_78 = 0.0;
      dStack_70 = 0.0;
      local_88 = 0.0;
      dStack_80 = 0.0;
      local_68 = 1.0;
      local_60 = (pointer)0x0;
      pSStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      local_168 = (int)err_00;
      ::std::__cxx11::string::_M_assign((string *)local_1a8);
      ::std::__cxx11::string::_M_assign((string *)&local_188);
      lVar4 = 0x10;
      pmVar5 = (bindTransforms->
               super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               )._M_impl.super__Vector_impl_data._M_start + (long)err_00;
      pdVar6 = &local_160;
      for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
        *pdVar6 = pmVar5->m[0][0];
        pmVar5 = (pointer)((long)pmVar5 + ((ulong)bVar7 * -2 + 1) * 8);
        pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
      }
      pmVar5 = (restTransforms->
               super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               )._M_impl.super__Vector_impl_data._M_start + (long)err_00;
      pdVar6 = &dStack_e0;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar6 = pmVar5->m[0][0];
        pmVar5 = (pointer)((long)pmVar5 + ((ulong)bVar7 * -2 + 1) * 8);
        pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
      }
      ::std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)visitSet,(unsigned_long *)&stack0xfffffffffffffe20);
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &local_48,bindTransforms);
      BuildSkelHierarchyImpl
                (visitSet,(SkelNode *)local_1a8,parentJointIds,joints,jointNames,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &local_48,restTransforms,err_00);
      ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      ~_Vector_base(&local_48);
      ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
      emplace_back<tinyusdz::tydra::SkelNode>(&parentNode->children,(SkelNode *)local_1a8);
      SkelNode::~SkelNode((SkelNode *)local_1a8);
    }
    err_00 = (string *)((long)&(err_00->_M_dataplus)._M_p + 1);
  }
  return SUB81(psVar1,0);
}

Assistant:

static bool BuildSkelHierarchyImpl(
    /* inout */ std::set<size_t> &visitSet,
    /* inout */ SkelNode &parentNode,
    const std::vector<int> &parentJointIds,
    const std::vector<value::token> &joints,
    const std::vector<value::token> &jointNames,
    const std::vector<value::matrix4d> bindTransforms,
    const std::vector<value::matrix4d> &restTransforms,
    std::string *err = nullptr) {
  // Simple linear search
  for (size_t i = 0; i < parentJointIds.size(); i++) {
    if (visitSet.count(i)) {
      continue;
    }

    int parentJointIdOfCurrIdx = parentJointIds[i];
    if (parentNode.joint_id == parentJointIdOfCurrIdx) {
      DCOUT("add joint " << i << "(parent = " << parentJointIdOfCurrIdx << ")");
      SkelNode node;
      node.joint_id = int(i);
      node.joint_path = joints[i].str();
      node.joint_name = jointNames[i].str();
      node.bind_transform = bindTransforms[i];
      node.rest_transform = restTransforms[i];

      visitSet.insert(i);

      // Recursively traverse children
      if (!BuildSkelHierarchyImpl(visitSet, node,
                                  parentJointIds, joints, jointNames, bindTransforms,
                                  restTransforms, err)) {
        return false;
      }

      parentNode.children.emplace_back(std::move(node));
    }
  }

  return true;
}